

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O2

FT_Error af_property_set(FT_Module ft_module,char *property_name,void *value,FT_Bool value_is_string
                        )

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  FT_Error FVar9;
  long lVar10;
  long lVar11;
  AF_StyleClass *ppAVar12;
  FT_Bool *no_stem_darkening;
  char *ep;
  FT_Int dp [8];
  
  iVar8 = strcmp(property_name,"fallback-script");
  if (iVar8 == 0) {
    if (value_is_string != '\0') {
      return 6;
    }
    ppAVar12 = af_style_classes;
    lVar11 = 0;
    while( true ) {
      if (lVar11 == 0x57) {
        return 6;
      }
      if (((*ppAVar12)->script == *value) && ((*ppAVar12)->coverage == AF_COVERAGE_DEFAULT)) break;
      lVar11 = lVar11 + 1;
      ppAVar12 = ppAVar12 + 1;
    }
    *(int *)&ft_module[1].clazz = (int)lVar11;
  }
  else {
    iVar8 = strcmp(property_name,"default-script");
    if (iVar8 == 0) {
      if (value_is_string != '\0') {
        return 6;
      }
      *(undefined4 *)((long)&ft_module[1].clazz + 4) = *value;
    }
    else {
      iVar8 = strcmp(property_name,"increase-x-height");
      if (iVar8 == 0) {
        if (value_is_string != '\0') {
          return 6;
        }
        FVar9 = af_property_get_face_globals(*value,(AF_FaceGlobals *)dp,(AF_Module)ft_module);
        if (FVar9 != 0) {
          return FVar9;
        }
        *(undefined4 *)(dp._0_8_ + 0x18) = *(undefined4 *)((long)value + 8);
      }
      else {
        iVar8 = strcmp(property_name,"darkening-parameters");
        if (iVar8 == 0) {
          if (value_is_string == '\0') {
            dp[7] = *(uint *)((long)value + 0x1c);
          }
          else {
            lVar11 = 0;
            while( true ) {
              lVar10 = strtol((char *)value,&ep,10);
              dp[7] = (FT_Int)lVar10;
              if (lVar11 == 7) break;
              dp[lVar11] = dp[7];
              if (*ep != ',') {
                return 6;
              }
              if ((char *)value == ep) {
                return 6;
              }
              value = ep + 1;
              lVar11 = lVar11 + 1;
            }
            if ((*ep & 0xdfU) != 0) {
              return 6;
            }
            if ((char *)value == ep) {
              return 6;
            }
            value = dp;
          }
          uVar1 = *value;
          uVar2 = *(uint *)((long)value + 4);
          uVar3 = *(uint *)((long)value + 8);
          uVar4 = *(uint *)((long)value + 0xc);
          uVar5 = *(uint *)((long)value + 0x10);
          uVar6 = *(uint *)((long)value + 0x14);
          uVar7 = *(uint *)((long)value + 0x18);
          if (((int)uVar5 < (int)uVar3 || (int)uVar3 < (int)uVar1) ||
              (int)(uVar2 | uVar4 | uVar6 | uVar5 | uVar7 | uVar1 | uVar3 | dp[7]) < 0) {
            return 6;
          }
          if ((int)uVar7 < (int)uVar5) {
            return 6;
          }
          if (500 < (int)uVar2) {
            return 6;
          }
          if (500 < uVar4) {
            return 6;
          }
          if (500 < uVar6) {
            return 6;
          }
          if (500 < (uint)dp[7]) {
            return 6;
          }
          *(uint *)((long)&ft_module[1].library + 4) = uVar1;
          *(uint *)&ft_module[1].memory = uVar2;
          *(uint *)((long)&ft_module[1].memory + 4) = uVar3;
          *(uint *)&ft_module[2].clazz = uVar4;
          *(uint *)((long)&ft_module[2].clazz + 4) = uVar5;
          *(uint *)&ft_module[2].library = uVar6;
          *(uint *)((long)&ft_module[2].library + 4) = uVar7;
          *(FT_Int *)&ft_module[2].memory = dp[7];
        }
        else {
          iVar8 = strcmp(property_name,"no-stem-darkening");
          if (iVar8 != 0) {
            return 0xc;
          }
          if (value_is_string != '\0') {
            lVar11 = strtol((char *)value,(char **)0x0,10);
            if (lVar11 == 0) {
              *(undefined1 *)&ft_module[1].library = 0;
              return 0;
            }
            *(undefined1 *)&ft_module[1].library = 1;
            return 0;
          }
          *(undefined1 *)&ft_module[1].library = *value;
        }
      }
    }
  }
  return 0;
}

Assistant:

static FT_Error
  af_property_set( FT_Module    ft_module,
                   const char*  property_name,
                   const void*  value,
                   FT_Bool      value_is_string )
  {
    FT_Error   error  = FT_Err_Ok;
    AF_Module  module = (AF_Module)ft_module;

#ifndef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
    FT_UNUSED( value_is_string );
#endif


    if ( !ft_strcmp( property_name, "fallback-script" ) )
    {
      AF_Script*  fallback_script;
      FT_UInt     ss;


#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
        return FT_THROW( Invalid_Argument );
#endif

      fallback_script = (AF_Script*)value;

      /* We translate the fallback script to a fallback style that uses */
      /* `fallback-script' as its script and `AF_COVERAGE_NONE' as its  */
      /* coverage value.                                                */
      for ( ss = 0; af_style_classes[ss]; ss++ )
      {
        AF_StyleClass  style_class = af_style_classes[ss];


        if ( style_class->script   == *fallback_script    &&
             style_class->coverage == AF_COVERAGE_DEFAULT )
        {
          module->fallback_style = ss;
          break;
        }
      }

      if ( !af_style_classes[ss] )
      {
        FT_TRACE2(( "af_property_set: Invalid value %d for property `%s'\n",
                    *fallback_script, property_name ));
        return FT_THROW( Invalid_Argument );
      }

      return error;
    }
    else if ( !ft_strcmp( property_name, "default-script" ) )
    {
      AF_Script*  default_script;


#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
        return FT_THROW( Invalid_Argument );
#endif

      default_script = (AF_Script*)value;

      module->default_script = *default_script;

      return error;
    }
    else if ( !ft_strcmp( property_name, "increase-x-height" ) )
    {
      FT_Prop_IncreaseXHeight*  prop;
      AF_FaceGlobals            globals;


#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
        return FT_THROW( Invalid_Argument );
#endif

      prop = (FT_Prop_IncreaseXHeight*)value;

      error = af_property_get_face_globals( prop->face, &globals, module );
      if ( !error )
        globals->increase_x_height = prop->limit;

      return error;
    }
    else if ( !ft_strcmp( property_name, "darkening-parameters" ) )
    {
      FT_Int*  darken_params;
      FT_Int   x1, y1, x2, y2, x3, y3, x4, y4;

#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      FT_Int   dp[8];


      if ( value_is_string )
      {
        const char*  s = (const char*)value;
        char*        ep;
        int          i;


        /* eight comma-separated numbers */
        for ( i = 0; i < 7; i++ )
        {
          dp[i] = (FT_Int)ft_strtol( s, &ep, 10 );
          if ( *ep != ',' || s == ep )
            return FT_THROW( Invalid_Argument );

          s = ep + 1;
        }

        dp[7] = (FT_Int)ft_strtol( s, &ep, 10 );
        if ( !( *ep == '\0' || *ep == ' ' ) || s == ep )
          return FT_THROW( Invalid_Argument );

        darken_params = dp;
      }
      else
#endif
        darken_params = (FT_Int*)value;

      x1 = darken_params[0];
      y1 = darken_params[1];
      x2 = darken_params[2];
      y2 = darken_params[3];
      x3 = darken_params[4];
      y3 = darken_params[5];
      x4 = darken_params[6];
      y4 = darken_params[7];

      if ( x1 < 0   || x2 < 0   || x3 < 0   || x4 < 0   ||
           y1 < 0   || y2 < 0   || y3 < 0   || y4 < 0   ||
           x1 > x2  || x2 > x3  || x3 > x4              ||
           y1 > 500 || y2 > 500 || y3 > 500 || y4 > 500 )
        return FT_THROW( Invalid_Argument );

      module->darken_params[0] = x1;
      module->darken_params[1] = y1;
      module->darken_params[2] = x2;
      module->darken_params[3] = y2;
      module->darken_params[4] = x3;
      module->darken_params[5] = y3;
      module->darken_params[6] = x4;
      module->darken_params[7] = y4;

      return error;
    }
    else if ( !ft_strcmp( property_name, "no-stem-darkening" ) )
    {
#ifdef FT_CONFIG_OPTION_ENVIRONMENT_PROPERTIES
      if ( value_is_string )
      {
        const char*  s   = (const char*)value;
        long         nsd = ft_strtol( s, NULL, 10 );


        if ( !nsd )
          module->no_stem_darkening = FALSE;
        else
          module->no_stem_darkening = TRUE;
      }
      else
#endif
      {
        FT_Bool*  no_stem_darkening = (FT_Bool*)value;


        module->no_stem_darkening = *no_stem_darkening;
      }

      return error;
    }

    FT_TRACE2(( "af_property_set: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }